

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

uint __thiscall
Assimp::glTFExporter::ExportNode(glTFExporter *this,aiNode *n,Ref<glTF::Node> *parent)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *this_00;
  char *__s;
  Node *pNVar5;
  Ref<glTF::Node> RVar6;
  Ref<glTF::Mesh> RVar7;
  value_type local_d8;
  uint local_c8;
  uint local_c4;
  uint idx;
  uint i_1;
  uint local_b8;
  value_type local_b0;
  uint local_9c;
  vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *pvStack_98;
  uint i;
  uint local_90;
  allocator<char> local_71;
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  Ref<glTF::Node> node;
  Ref<glTF::Node> *parent_local;
  aiNode *n_local;
  glTFExporter *this_local;
  
  node._8_8_ = parent;
  peVar4 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  this_00 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&this->mAsset);
  __s = aiString::C_Str(&n->mName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
  glTF::Asset::FindUniqueID(&local_50,this_00,&local_70,"node");
  RVar6 = glTF::LazyDict<glTF::Node>::Create(&peVar4->nodes,&local_50);
  pvStack_98 = RVar6.vector;
  local_90 = RVar6.index;
  local_30 = (undefined1  [8])pvStack_98;
  node.vector._0_4_ = local_90;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  uVar1 = node._8_8_;
  pNVar5 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_30);
  (pNVar5->parent).vector = *(vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> **)uVar1;
  (pNVar5->parent).index = *(uint *)(uVar1 + 8);
  bVar2 = aiMatrix4x4t<float>::IsIdentity(&n->mTransformation);
  if (!bVar2) {
    pNVar5 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_30);
    (pNVar5->matrix).isPresent = true;
    pNVar5 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_30);
    CopyValue(&n->mTransformation,(pNVar5->matrix).value);
  }
  for (local_9c = 0; local_9c < n->mNumMeshes; local_9c = local_9c + 1) {
    pNVar5 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_30);
    peVar4 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar7 = glTF::LazyDict<glTF::Mesh>::Get(&peVar4->meshes,n->mMeshes[local_9c]);
    _idx = RVar7.vector;
    local_b8 = RVar7.index;
    local_b0.vector = _idx;
    local_b0.index = local_b8;
    std::vector<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>::push_back
              (&pNVar5->meshes,&local_b0);
  }
  for (local_c4 = 0; local_c4 < n->mNumChildren; local_c4 = local_c4 + 1) {
    local_c8 = ExportNode(this,n->mChildren[local_c4],(Ref<glTF::Node> *)local_30);
    pNVar5 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_30);
    peVar4 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar6 = glTF::LazyDict<glTF::Node>::Get(&peVar4->nodes,local_c8);
    local_d8.vector = RVar6.vector;
    local_d8.index = RVar6.index;
    std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::push_back
              (&pNVar5->children,&local_d8);
  }
  uVar3 = glTF::Ref<glTF::Node>::GetIndex((Ref<glTF::Node> *)local_30);
  return uVar3;
}

Assistant:

unsigned int glTFExporter::ExportNode(const aiNode* n, Ref<Node>& parent)
{
    Ref<Node> node = mAsset->nodes.Create(mAsset->FindUniqueID(n->mName.C_Str(), "node"));

    node->parent = parent;

    if (!n->mTransformation.IsIdentity()) {
        node->matrix.isPresent = true;
        CopyValue(n->mTransformation, node->matrix.value);
    }

    for (unsigned int i = 0; i < n->mNumMeshes; ++i) {
        node->meshes.push_back(mAsset->meshes.Get(n->mMeshes[i]));
    }

    for (unsigned int i = 0; i < n->mNumChildren; ++i) {
        unsigned int idx = ExportNode(n->mChildren[i], node);
        node->children.push_back(mAsset->nodes.Get(idx));
    }

    return node.GetIndex();
}